

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filecache.c
# Opt level: O0

void h2o_filecache_clear(h2o_filecache_t *cache)

{
  uint local_14;
  khiter_t iter;
  h2o_filecache_t *cache_local;
  
  for (local_14 = 0; local_14 != cache->hash->n_buckets; local_14 = local_14 + 1) {
    if ((cache->hash->flags[local_14 >> 4] >> (sbyte)((local_14 & 0xf) << 1) & 3) == 0) {
      release_from_cache(cache,local_14);
    }
  }
  if (cache->hash->size != 0) {
    __assert_fail("kh_size(cache->hash) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/lib/common/filecache.c"
                  ,0x50,"void h2o_filecache_clear(h2o_filecache_t *)");
  }
  return;
}

Assistant:

void h2o_filecache_clear(h2o_filecache_t *cache)
{
    khiter_t iter;
    for (iter = kh_begin(cache->hash); iter != kh_end(cache->hash); ++iter) {
        if (!kh_exist(cache->hash, iter))
            continue;
        release_from_cache(cache, iter);
    }
    assert(kh_size(cache->hash) == 0);
}